

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaAllocator_T::GetAllocationInfo
          (VmaAllocator_T *this,VmaAllocation hAllocation,VmaAllocationInfo *pAllocationInfo)

{
  char *pcVar1;
  VkDeviceMemory pVVar2;
  VkDeviceSize VVar3;
  void *pvVar4;
  
  pAllocationInfo->memoryType = hAllocation->m_MemoryTypeIndex;
  pVVar2 = VmaAllocation_T::GetMemory(hAllocation);
  pAllocationInfo->deviceMemory = pVVar2;
  VVar3 = VmaAllocation_T::GetOffset(hAllocation);
  pAllocationInfo->offset = VVar3;
  pAllocationInfo->size = hAllocation->m_Size;
  pvVar4 = VmaAllocation_T::GetMappedData(hAllocation);
  pAllocationInfo->pMappedData = pvVar4;
  pcVar1 = hAllocation->m_pName;
  pAllocationInfo->pUserData = hAllocation->m_pUserData;
  pAllocationInfo->pName = pcVar1;
  return;
}

Assistant:

void VmaAllocator_T::GetAllocationInfo(VmaAllocation hAllocation, VmaAllocationInfo* pAllocationInfo)
{
    pAllocationInfo->memoryType = hAllocation->GetMemoryTypeIndex();
    pAllocationInfo->deviceMemory = hAllocation->GetMemory();
    pAllocationInfo->offset = hAllocation->GetOffset();
    pAllocationInfo->size = hAllocation->GetSize();
    pAllocationInfo->pMappedData = hAllocation->GetMappedData();
    pAllocationInfo->pUserData = hAllocation->GetUserData();
    pAllocationInfo->pName = hAllocation->GetName();
}